

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

bool chaiscript::eval::
     AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
     get_scoped_bool_condition
               (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node
               ,Dispatch_State *t_ss)

{
  bool bVar1;
  undefined1 local_30 [24];
  Scope_Push_Pop spp;
  Dispatch_State *t_ss_local;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node_local;
  
  spp.m_ds = t_ss;
  detail::Scope_Push_Pop::Scope_Push_Pop((Scope_Push_Pop *)(local_30 + 0x10),t_ss);
  eval((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)local_30,
       (Dispatch_State *)node);
  bVar1 = AST_Node::get_bool_condition((Boxed_Value *)local_30,spp.m_ds);
  Boxed_Value::~Boxed_Value((Boxed_Value *)local_30);
  detail::Scope_Push_Pop::~Scope_Push_Pop((Scope_Push_Pop *)(local_30 + 0x10));
  return bVar1;
}

Assistant:

static bool get_scoped_bool_condition(const AST_Node_Impl<T> &node, const chaiscript::detail::Dispatch_State &t_ss) {
        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
        return get_bool_condition(node.eval(t_ss), t_ss);
      }